

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_classes.h
# Opt level: O0

void * object_alloc(t_class *c)

{
  undefined8 *x;
  object_inlets *this;
  mapped_type *this_00;
  undefined8 *local_48;
  undefined1 local_40 [8];
  t_mock_outlets mock_outlets;
  t_object *o;
  t_class *c_local;
  
  x = (undefined8 *)malloc(c->c_size);
  *x = c->c_messlist;
  x[1] = 0x68cebd9b;
  this = (object_inlets *)operator_new(0x20);
  c74::max::object_inlets::object_inlets(this,x);
  x[2] = this;
  std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::vector
            ((vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_> *)local_40);
  local_48 = x;
  this_00 = std::
            unordered_map<void_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>_>
            ::operator[]((unordered_map<void_*,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>_>_>_>
                          *)c74::max::g_object_to_outletset,&local_48);
  std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::operator=
            (this_00,(vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_> *)
                     local_40);
  std::vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_>::~vector
            ((vector<c74::max::t_mock_outlet,_std::allocator<c74::max::t_mock_outlet>_> *)local_40);
  return x;
}

Assistant:

MOCK_EXPORT void *object_alloc(t_class *c)
{
    t_object *o = (t_object*)malloc(c->c_size);

    o->o_messlist = c->c_messlist;
    o->o_magic = OB_MAGIC;
    o->o_inlet = (t_inlet*) new object_inlets(o);
    {
        t_mock_outlets	mock_outlets;

        // outlets are accessed through a global hash rather than by this struct member
        // this is because many outlet calls do not include the t_object pointer!
        // o->o_outlet = (struct outlet*) new t_mock_outlets;
        g_object_to_outletset[o] = mock_outlets;
    }
    return o;
}